

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void testGFMath(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Field *pFVar5;
  ostream *poVar6;
  ulong uVar7;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  initializer_list<int> __l;
  Element local_3a8;
  Element E;
  Element F;
  Element G;
  Element local_368;
  Element B;
  Element A;
  Element C;
  Element local_328;
  Element H;
  Element D;
  Element local_2f8;
  Element local_2e8;
  Element local_2d8;
  ulong local_2c8;
  Element local_2c0;
  vector<int,_std::allocator<int>_> gfs;
  Element local_298;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  Field gf;
  
  puts("\tTesting Galois field arithmetic...");
  gf.n = 9;
  gf.p = 0xb;
  gf.q = 0xd;
  gf._12_4_ = 0x10;
  gf.inv.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0x31;
  __l._M_len = 5;
  __l._M_array = &gf.n;
  std::vector<int,_std::allocator<int>_>::vector(&gfs,__l,(allocator_type *)&E);
  uVar7 = 0;
  while( true ) {
    if ((ulong)((long)gfs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)gfs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) <= uVar7) break;
    local_2c8 = uVar7;
    Galois::Field::Field
              (&gf,gfs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                   ._M_start[uVar7]);
    poVar6 = std::operator<<((ostream *)&std::cout,"Testing GF(");
    poVar6 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)poVar6,
                        gfs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[local_2c8]);
    poVar6 = std::operator<<(poVar6,")");
    std::endl<char,std::char_traits<char>>(poVar6);
    Galois::Element::Element(&E,&gf,0);
    Galois::Element::Element(&F,&gf,0);
    Galois::Element::Element(&G,&gf,0);
    Galois::Element::Element(&H,&gf,0);
    Galois::Element::Element(&A,&gf,1);
    Galois::Element::Element(&B,&gf,2);
    Galois::Element::Element(&C,&gf,3);
    Galois::Element::Element(&D,&gf,6);
    poVar6 = std::operator<<((ostream *)&std::cout,"A: ");
    std::ostream::operator<<((ostream *)poVar6,A.m_value);
    std::endl<char,std::char_traits<char>>(poVar6);
    poVar6 = std::operator<<((ostream *)&std::cout,"B: ");
    std::ostream::operator<<((ostream *)poVar6,B.m_value);
    std::endl<char,std::char_traits<char>>(poVar6);
    poVar6 = std::operator<<((ostream *)&std::cout,"C: ");
    std::ostream::operator<<((ostream *)poVar6,C.m_value);
    std::endl<char,std::char_traits<char>>(poVar6);
    poVar6 = std::operator<<((ostream *)&std::cout,"D: ");
    std::ostream::operator<<((ostream *)poVar6,D.m_value);
    std::endl<char,std::char_traits<char>>(poVar6);
    std::operator<<((ostream *)&std::cout,"\nACTION: E = A + B\n");
    Galois::Element::operator+(&local_3a8,&A);
    E.m_gf = local_3a8.m_gf;
    E.m_value = local_3a8.m_value;
    poVar6 = std::operator<<((ostream *)&std::cout,"RESULT: E = ");
    std::ostream::operator<<((ostream *)poVar6,E.m_value);
    std::operator<<((ostream *)&std::cout,"\nACTION: E = -A\n");
    Galois::Element::negative(&local_3a8);
    E.m_gf = local_3a8.m_gf;
    E.m_value = local_3a8.m_value;
    poVar6 = std::operator<<((ostream *)&std::cout,"RESULT: E = ");
    std::ostream::operator<<((ostream *)poVar6,E.m_value);
    std::operator<<((ostream *)&std::cout,"\nACTION: F = -E\n");
    Galois::Element::negative(&local_3a8);
    F.m_gf = local_3a8.m_gf;
    F.m_value = local_3a8.m_value;
    poVar6 = std::operator<<((ostream *)&std::cout,"RESULT: F = ");
    std::ostream::operator<<((ostream *)poVar6,F.m_value);
    iVar4 = A.m_value;
    iVar3 = F.m_value;
    iVar1 = (F.m_gf)->q;
    iVar2 = (A.m_gf)->q;
    std::__cxx11::string::string
              ((string *)&local_108,"ERROR: F==A is false",(allocator *)&local_3a8);
    Assert(iVar3 == iVar4 && iVar1 == iVar2,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::operator<<((ostream *)&std::cout,"\nOK: F==A is true\n");
    std::operator<<((ostream *)&std::cout,"\nACTION: copy constructor: Galois::Element CopyofD(D)\n"
                   );
    iVar3 = D.m_value;
    pFVar5 = D.m_gf;
    poVar6 = std::operator<<((ostream *)&std::cout,"RESULT: CopyofD = ");
    std::ostream::operator<<((ostream *)poVar6,iVar3);
    iVar4 = D.m_value;
    iVar1 = pFVar5->q;
    iVar2 = (D.m_gf)->q;
    std::__cxx11::string::string
              ((string *)&local_128,"ERROR: CopyofD==D is false",(allocator *)&local_3a8);
    Assert(iVar3 == iVar4 && iVar1 == iVar2,&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    std::operator<<((ostream *)&std::cout,"\nOK: CopyofD==D is true\n");
    std::operator<<((ostream *)&std::cout,"\nACTION: F = C - D\n");
    Galois::Element::operator-(&local_3a8,&C);
    F.m_gf = local_3a8.m_gf;
    F.m_value = local_3a8.m_value;
    poVar6 = std::operator<<((ostream *)&std::cout,"RESULT: F = ");
    std::ostream::operator<<((ostream *)poVar6,F.m_value);
    std::operator<<((ostream *)&std::cout,"\nACTION: E = D + F\n");
    Galois::Element::operator+(&local_3a8,&D);
    E.m_gf = local_3a8.m_gf;
    E.m_value = local_3a8.m_value;
    poVar6 = std::operator<<((ostream *)&std::cout,"RESULT: E = ");
    std::ostream::operator<<((ostream *)poVar6,E.m_value);
    iVar4 = C.m_value;
    iVar3 = E.m_value;
    iVar1 = (C.m_gf)->q;
    iVar2 = (E.m_gf)->q;
    std::__cxx11::string::string
              ((string *)&local_148,"ERROR: C==E is false",(allocator *)&local_3a8);
    Assert(iVar4 == iVar3 && iVar1 == iVar2,&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    std::operator<<((ostream *)&std::cout,"\nOK: C==E is true\n");
    std::operator<<((ostream *)&std::cout,"\nACTION: F = A * B\n");
    Galois::Element::operator*(&local_3a8,&A);
    F.m_gf = local_3a8.m_gf;
    F.m_value = local_3a8.m_value;
    poVar6 = std::operator<<((ostream *)&std::cout,"RESULT: F = ");
    std::ostream::operator<<((ostream *)poVar6,F.m_value);
    std::operator<<((ostream *)&std::cout,"\nACTION: E = F / A\n");
    Galois::Element::operator/(&local_3a8,&F);
    E.m_gf = local_3a8.m_gf;
    E.m_value = local_3a8.m_value;
    poVar6 = std::operator<<((ostream *)&std::cout,"RESULT: E = ");
    std::ostream::operator<<((ostream *)poVar6,E.m_value);
    iVar4 = B.m_value;
    iVar3 = E.m_value;
    iVar1 = (B.m_gf)->q;
    iVar2 = (E.m_gf)->q;
    std::__cxx11::string::string
              ((string *)&local_168,"ERROR: B==E is false",(allocator *)&local_3a8);
    Assert(iVar4 == iVar3 && iVar1 == iVar2,&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    std::operator<<((ostream *)&std::cout,"\nOK: B==E is true\n");
    std::operator<<((ostream *)&std::cout,"\nACTION: F = A / B\n");
    Galois::Element::operator/(&local_3a8,&A);
    F.m_gf = local_3a8.m_gf;
    F.m_value = local_3a8.m_value;
    poVar6 = std::operator<<((ostream *)&std::cout,"RESULT: F = ");
    std::ostream::operator<<((ostream *)poVar6,F.m_value);
    std::operator<<((ostream *)&std::cout,"\nACTION: E = F * B\n");
    Galois::Element::operator*(&local_3a8,&F);
    E.m_gf = local_3a8.m_gf;
    E.m_value = local_3a8.m_value;
    poVar6 = std::operator<<((ostream *)&std::cout,"RESULT: E = ");
    std::ostream::operator<<((ostream *)poVar6,E.m_value);
    iVar4 = A.m_value;
    iVar3 = E.m_value;
    iVar1 = (A.m_gf)->q;
    iVar2 = (E.m_gf)->q;
    std::__cxx11::string::string
              ((string *)&local_188,"ERROR: A==E is false",(allocator *)&local_3a8);
    Assert(iVar4 == iVar3 && iVar1 == iVar2,&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    std::operator<<((ostream *)&std::cout,"\nOK: A==E is true\n");
    std::operator<<((ostream *)&std::cout,"\nACTION: E = a * B\n");
    Galois::operator*((Galois *)&local_3a8,2,&B);
    E.m_gf = local_3a8.m_gf;
    E.m_value = local_3a8.m_value;
    poVar6 = std::operator<<((ostream *)&std::cout,"RESULT: E = ");
    std::ostream::operator<<((ostream *)poVar6,E.m_value);
    std::operator<<((ostream *)&std::cout,"\nACTION: F = A * b\n");
    Galois::Element::operator*(&local_3a8,(int)&A);
    F.m_gf = local_3a8.m_gf;
    F.m_value = local_3a8.m_value;
    poVar6 = std::operator<<((ostream *)&std::cout,"RESULT: F = ");
    std::ostream::operator<<((ostream *)poVar6,F.m_value);
    std::operator<<((ostream *)&std::cout,"\nACTION: G = E + F\n");
    Galois::Element::operator+(&local_3a8,&E);
    G.m_gf = local_3a8.m_gf;
    G.m_value = local_3a8.m_value;
    poVar6 = std::operator<<((ostream *)&std::cout,"RESULT: G = ");
    std::ostream::operator<<((ostream *)poVar6,G.m_value);
    std::operator<<((ostream *)&std::cout,"\nACTION: E = B * a\n");
    Galois::Element::operator*(&local_3a8,(int)&B);
    E.m_gf = local_3a8.m_gf;
    E.m_value = local_3a8.m_value;
    poVar6 = std::operator<<((ostream *)&std::cout,"RESULT: E = ");
    std::ostream::operator<<((ostream *)poVar6,E.m_value);
    std::operator<<((ostream *)&std::cout,"\nACTION: F = b * A\n");
    Galois::operator*((Galois *)&local_3a8,3,&A);
    F.m_gf = local_3a8.m_gf;
    F.m_value = local_3a8.m_value;
    poVar6 = std::operator<<((ostream *)&std::cout,"RESULT: F = ");
    std::ostream::operator<<((ostream *)poVar6,F.m_value);
    std::operator<<((ostream *)&std::cout,"\nACTION: H = F + E\n");
    Galois::Element::operator+(&local_3a8,&F);
    H.m_gf = local_3a8.m_gf;
    H.m_value = local_3a8.m_value;
    poVar6 = std::operator<<((ostream *)&std::cout,"RESULT: G = ");
    std::ostream::operator<<((ostream *)poVar6,G.m_value);
    iVar4 = H.m_value;
    iVar3 = G.m_value;
    iVar1 = (G.m_gf)->q;
    iVar2 = (H.m_gf)->q;
    std::__cxx11::string::string
              ((string *)&local_1a8,"ERROR: G==H is false",(allocator *)&local_3a8);
    Assert(iVar3 == iVar4 && iVar1 == iVar2,&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::operator<<((ostream *)&std::cout,"\nOK: G==H is true\n");
    std::operator<<((ostream *)&std::cout,"\nACTION: G = A * B + C * D\n");
    Galois::Element::operator*(&local_368,&A);
    Galois::Element::operator*(&local_328,&C);
    Galois::Element::operator+(&local_3a8,&local_368);
    G.m_gf = local_3a8.m_gf;
    G.m_value = local_3a8.m_value;
    poVar6 = std::operator<<((ostream *)&std::cout,"RESULT: G = ");
    std::ostream::operator<<((ostream *)poVar6,G.m_value);
    std::operator<<((ostream *)&std::cout,"\nACTION: H = D * C + B * A\n");
    Galois::Element::operator*(&local_368,&D);
    Galois::Element::operator*(&local_328,&B);
    Galois::Element::operator+(&local_3a8,&local_368);
    H.m_gf = local_3a8.m_gf;
    H.m_value = local_3a8.m_value;
    poVar6 = std::operator<<((ostream *)&std::cout,"RESULT: H = ");
    std::ostream::operator<<((ostream *)poVar6,H.m_value);
    iVar4 = H.m_value;
    iVar3 = G.m_value;
    iVar1 = (G.m_gf)->q;
    iVar2 = (H.m_gf)->q;
    std::__cxx11::string::string
              ((string *)&local_1c8,"ERROR: G==H is false",(allocator *)&local_3a8);
    Assert(iVar3 == iVar4 && iVar1 == iVar2,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::operator<<((ostream *)&std::cout,"\nOK: G==H is true\n");
    std::operator<<((ostream *)&std::cout,"\nACTION: G = A * B * C * D\n");
    Galois::Element::operator*(&local_328,&A);
    Galois::Element::operator*(&local_368,&local_328);
    Galois::Element::operator*(&local_3a8,&local_368);
    G.m_gf = local_3a8.m_gf;
    G.m_value = local_3a8.m_value;
    poVar6 = std::operator<<((ostream *)&std::cout,"RESULT: G = ");
    std::ostream::operator<<((ostream *)poVar6,G.m_value);
    std::operator<<((ostream *)&std::cout,"\nACTION: G = G / A\n");
    Galois::Element::operator/(&local_328,&G);
    Galois::Element::operator/(&local_368,&local_328);
    Galois::Element::operator/(&local_3a8,&local_368);
    H.m_gf = local_3a8.m_gf;
    H.m_value = local_3a8.m_value;
    poVar6 = std::operator<<((ostream *)&std::cout,"RESULT: G = ");
    std::ostream::operator<<((ostream *)poVar6,H.m_value);
    iVar4 = H.m_value;
    iVar3 = B.m_value;
    iVar1 = (B.m_gf)->q;
    iVar2 = (H.m_gf)->q;
    std::__cxx11::string::string
              ((string *)&local_1e8,"ERROR: B==H is false",(allocator *)&local_3a8);
    Assert(iVar3 == iVar4 && iVar1 == iVar2,&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::operator<<((ostream *)&std::cout,"\nOK: B==H is true\n");
    std::operator<<((ostream *)&std::cout,"\nACTION: G = A * B * C * D * A * B * D * C\n");
    Galois::Element::operator*(&local_2f8,&A);
    Galois::Element::operator*(&local_2e8,&local_2f8);
    Galois::Element::operator*(&local_2c0,&local_2e8);
    Galois::Element::operator*(&local_2d8,&local_2c0);
    Galois::Element::operator*(&local_328,&local_2d8);
    Galois::Element::operator*(&local_368,&local_328);
    Galois::Element::operator*(&local_3a8,&local_368);
    G.m_gf = local_3a8.m_gf;
    G.m_value = local_3a8.m_value;
    poVar6 = std::operator<<((ostream *)&std::cout,"RESULT: G = ");
    std::ostream::operator<<((ostream *)poVar6,G.m_value);
    std::operator<<((ostream *)&std::cout,"\nACTION: H = A * A * C * C * B * B * D * D\n");
    Galois::Element::operator*(&local_2f8,&A);
    Galois::Element::operator*(&local_2e8,&local_2f8);
    Galois::Element::operator*(&local_2c0,&local_2e8);
    Galois::Element::operator*(&local_2d8,&local_2c0);
    Galois::Element::operator*(&local_328,&local_2d8);
    Galois::Element::operator*(&local_368,&local_328);
    Galois::Element::operator*(&local_3a8,&local_368);
    H.m_gf = local_3a8.m_gf;
    H.m_value = local_3a8.m_value;
    poVar6 = std::operator<<((ostream *)&std::cout,"RESULT: H = ");
    std::ostream::operator<<((ostream *)poVar6,H.m_value);
    iVar4 = H.m_value;
    iVar3 = G.m_value;
    iVar1 = (G.m_gf)->q;
    iVar2 = (H.m_gf)->q;
    std::__cxx11::string::string
              ((string *)&local_208,"ERROR: G==H is false",(allocator *)&local_3a8);
    Assert(iVar3 == iVar4 && iVar1 == iVar2,&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::operator<<((ostream *)&std::cout,"\nOK: G==H is true\n");
    std::operator<<((ostream *)&std::cout,"\nACTION: E = (A + B) * C\n");
    Galois::Element::operator+(&local_368,&A);
    Galois::Element::operator*(&local_3a8,&local_368);
    E.m_gf = local_3a8.m_gf;
    E.m_value = local_3a8.m_value;
    poVar6 = std::operator<<((ostream *)&std::cout,"RESULT: E = ");
    std::ostream::operator<<((ostream *)poVar6,E.m_value);
    std::operator<<((ostream *)&std::cout,"\nACTION: F = A * C + B * C\n");
    Galois::Element::operator*(&local_368,&A);
    Galois::Element::operator*(&local_328,&B);
    Galois::Element::operator+(&local_3a8,&local_368);
    F.m_gf = local_3a8.m_gf;
    F.m_value = local_3a8.m_value;
    poVar6 = std::operator<<((ostream *)&std::cout,"RESULT: F = ");
    std::ostream::operator<<((ostream *)poVar6,F.m_value);
    iVar4 = F.m_value;
    iVar3 = E.m_value;
    iVar1 = (E.m_gf)->q;
    iVar2 = (F.m_gf)->q;
    std::__cxx11::string::string
              ((string *)&local_228,"ERROR: E==F is false",(allocator *)&local_3a8);
    Assert(iVar3 == iVar4 && iVar1 == iVar2,&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    std::operator<<((ostream *)&std::cout,"\nOK: E==F is true\n");
    std::operator<<((ostream *)&std::cout,"\nACTION: E = (A + C) * (B + D)\n");
    Galois::Element::operator+(&local_368,&A);
    Galois::Element::operator+(&local_328,&B);
    Galois::Element::operator*(&local_3a8,&local_368);
    E.m_gf = local_3a8.m_gf;
    E.m_value = local_3a8.m_value;
    poVar6 = std::operator<<((ostream *)&std::cout,"RESULT: E = ");
    std::ostream::operator<<((ostream *)poVar6,E.m_value);
    std::operator<<((ostream *)&std::cout,"\nACTION: F = B * A + D * A + C * B + D * C\n");
    Galois::Element::operator*(&local_2d8,&B);
    Galois::Element::operator*(&local_2c0,&D);
    Galois::Element::operator+(&local_328,&local_2d8);
    Galois::Element::operator*(&local_2e8,&C);
    Galois::Element::operator+(&local_368,&local_328);
    Galois::Element::operator*(&local_2f8,&D);
    Galois::Element::operator+(&local_3a8,&local_368);
    F.m_gf = local_3a8.m_gf;
    F.m_value = local_3a8.m_value;
    poVar6 = std::operator<<((ostream *)&std::cout,"RESULT: F = ");
    std::ostream::operator<<((ostream *)poVar6,F.m_value);
    iVar4 = F.m_value;
    iVar3 = E.m_value;
    iVar1 = (E.m_gf)->q;
    iVar2 = (F.m_gf)->q;
    std::__cxx11::string::string
              ((string *)&local_248,"ERROR: E==F is false",(allocator *)&local_3a8);
    Assert(iVar3 == iVar4 && iVar1 == iVar2,&local_248);
    std::__cxx11::string::~string((string *)&local_248);
    std::operator<<((ostream *)&std::cout,"\nOK: E==F is true\n");
    std::operator<<((ostream *)&std::cout,"\nACTION: E = (A + C) / (B + D)\n");
    poVar6 = std::operator<<((ostream *)&std::cout,"A + C = ");
    Galois::Element::operator+(&local_3a8,&A);
    std::ostream::operator<<((ostream *)poVar6,local_3a8.m_value);
    std::endl<char,std::char_traits<char>>(poVar6);
    poVar6 = std::operator<<((ostream *)&std::cout,"B + D = ");
    Galois::Element::operator+(&local_3a8,&B);
    std::ostream::operator<<((ostream *)poVar6,local_3a8.m_value);
    std::endl<char,std::char_traits<char>>(poVar6);
    Galois::Element::operator+(&local_368,&A);
    Galois::Element::operator+(&local_328,&B);
    Galois::Element::operator/(&local_3a8,&local_368);
    E.m_gf = local_3a8.m_gf;
    E.m_value = local_3a8.m_value;
    poVar6 = std::operator<<((ostream *)&std::cout,"RESULT: E = ");
    std::ostream::operator<<((ostream *)poVar6,E.m_value);
    std::operator<<((ostream *)&std::cout,"\nACTION: F = (D + B) / (C + A)\n");
    Galois::Element::operator+(&local_368,&D);
    Galois::Element::operator+(&local_328,&C);
    Galois::Element::operator/(&local_3a8,&local_368);
    F.m_gf = local_3a8.m_gf;
    F.m_value = local_3a8.m_value;
    poVar6 = std::operator<<((ostream *)&std::cout,"RESULT: F = ");
    std::ostream::operator<<((ostream *)poVar6,F.m_value);
    std::operator<<((ostream *)&std::cout,"\nACTION: G = E * F\n");
    Galois::Element::operator*(&local_3a8,&E);
    G.m_gf = local_3a8.m_gf;
    G.m_value = local_3a8.m_value;
    poVar6 = std::operator<<((ostream *)&std::cout,"RESULT: G = ");
    std::ostream::operator<<((ostream *)poVar6,G.m_value);
    std::operator<<((ostream *)&std::cout,"\nACTION: E = 2*A + C*D\n");
    Galois::operator*((Galois *)&local_368,2,&A);
    Galois::Element::operator*(&local_328,&C);
    Galois::Element::operator+(&local_3a8,&local_368);
    E.m_gf = local_3a8.m_gf;
    E.m_value = local_3a8.m_value;
    poVar6 = std::operator<<((ostream *)&std::cout,"RESULT: E = ");
    std::ostream::operator<<((ostream *)poVar6,E.m_value);
    std::operator<<((ostream *)&std::cout,"\nACTION: F = B*B - 5*D\n");
    Galois::Element::operator*(&local_368,&B);
    Galois::operator*((Galois *)&local_328,5,&D);
    Galois::Element::operator-(&local_3a8,&local_368);
    F.m_gf = local_3a8.m_gf;
    F.m_value = local_3a8.m_value;
    poVar6 = std::operator<<((ostream *)&std::cout,"RESULT: F = ");
    std::ostream::operator<<((ostream *)poVar6,F.m_value);
    std::operator<<((ostream *)&std::cout,"\nACTION: G = E / F\n");
    Galois::Element::operator/(&local_3a8,&E);
    G.m_gf = local_3a8.m_gf;
    G.m_value = local_3a8.m_value;
    poVar6 = std::operator<<((ostream *)&std::cout,"RESULT: G = ");
    std::ostream::operator<<((ostream *)poVar6,G.m_value);
    std::operator<<((ostream *)&std::cout,"\nACTION: F = ((-D)*5 + B*B) / (D*C + A*2)\n");
    Galois::Element::negative(&local_2d8);
    Galois::Element::operator*(&local_328,(int)&local_2d8);
    Galois::Element::operator*(&local_2c0,&B);
    Galois::Element::operator+(&local_368,&local_328);
    Galois::Element::operator*(&local_2f8,&D);
    Galois::Element::operator*(&local_298,(int)&A);
    Galois::Element::operator+(&local_2e8,&local_2f8);
    Galois::Element::operator/(&local_3a8,&local_368);
    F.m_gf = local_3a8.m_gf;
    F.m_value = local_3a8.m_value;
    poVar6 = std::operator<<((ostream *)&std::cout,"RESULT: F = ");
    std::ostream::operator<<((ostream *)poVar6,F.m_value);
    std::operator<<((ostream *)&std::cout,"\nACTION: G = E * F\n");
    Galois::Element::operator*(&local_3a8,&E);
    G.m_gf = local_3a8.m_gf;
    G.m_value = local_3a8.m_value;
    poVar6 = std::operator<<((ostream *)&std::cout,"RESULT: G = ");
    std::ostream::operator<<((ostream *)poVar6,G.m_value);
    std::operator<<((ostream *)&std::cout,"\nACTION: E = A / A\n");
    Galois::Element::operator/(&local_3a8,&A);
    E.m_gf = local_3a8.m_gf;
    E.m_value = local_3a8.m_value;
    poVar6 = std::operator<<((ostream *)&std::cout,"RESULT: E = ");
    std::ostream::operator<<((ostream *)poVar6,E.m_value);
    std::operator<<((ostream *)&std::cout,"\nACTION: E = sqrt(A)\n");
    Galois::Element::sqrt(&local_3a8,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    E.m_gf = local_3a8.m_gf;
    E.m_value = local_3a8.m_value;
    poVar6 = std::operator<<((ostream *)&std::cout,"RESULT: E = ");
    std::ostream::operator<<((ostream *)poVar6,E.m_value);
    iVar1 = E.m_value;
    std::__cxx11::string::string
              ((string *)&local_268,"ERROR: A has no root",(allocator *)&local_3a8);
    Assert((bool)((byte)~(byte)((uint)iVar1 >> 0x18) >> 7),&local_268);
    std::__cxx11::string::~string((string *)&local_268);
    std::operator<<((ostream *)&std::cout,"\nACTION: F = E * E\n");
    Galois::Element::operator*(&local_3a8,&E);
    F.m_gf = local_3a8.m_gf;
    F.m_value = local_3a8.m_value;
    poVar6 = std::operator<<((ostream *)&std::cout,"RESULT: F = ");
    std::ostream::operator<<((ostream *)poVar6,F.m_value);
    iVar4 = A.m_value;
    iVar3 = F.m_value;
    iVar1 = (A.m_gf)->q;
    iVar2 = (F.m_gf)->q;
    std::__cxx11::string::string
              ((string *)&local_288,"ERROR: A==F is false",(allocator *)&local_3a8);
    Assert(iVar4 == iVar3 && iVar1 == iVar2,&local_288);
    std::__cxx11::string::~string((string *)&local_288);
    std::operator<<((ostream *)&std::cout,"\nOK: A==F is true\n");
    std::operator<<((ostream *)&std::cout,"\n---------------------------------------------------\n")
    ;
    Galois::Field::~Field(&gf);
    uVar7 = local_2c8 + 1;
  }
  puts("passed");
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&gfs.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void testGFMath()
{
    printf("\tTesting Galois field arithmetic...\n");
    vector<int> gfs = {9, 11, 13, 16, 49};

    for (size_t i = 0; i < gfs.size(); ++i)
    {
        // Define Galois Galois::Field
        Galois::Field gf(gfs[i]);
        cout << "Testing GF(" << gfs[i] << ")" << endl;
        //---------------------------------

        Galois::Element E(&gf), F(&gf), G(&gf), H(&gf);

        int a = 2, b = 3;
        // cout << "a=" << a << "  b=" << b << endl;

        Galois::Element A(&gf, 1);
        Galois::Element B(&gf, 2);
        Galois::Element C(&gf, 3);
        Galois::Element D(&gf, 6);

        cout << "A: " << A << endl;
        cout << "B: " << B << endl;
        cout << "C: " << C << endl;
        cout << "D: " << D << endl;

        //*********************** action begins ************************

        try
        {
            cout << "\nACTION: E = A + B\n";
            E = A + B;
            cout << "RESULT: E = " << E;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        //-------------------------------------------------------------
        cout << "\nACTION: E = -A\n";
        E = -A;
        cout << "RESULT: E = " << E;

        cout << "\nACTION: F = -E\n";
        F = -E;
        cout << "RESULT: F = " << F;

        Assert(F == A, "ERROR: F==A is false");
        cout << "\nOK: F==A is true\n";

        //-------------------------------------------------------------
        cout << "\nACTION: copy constructor: Galois::Element CopyofD(D)\n";
        Galois::Element CopyofD(D);
        cout << "RESULT: CopyofD = " << CopyofD;

        Assert(CopyofD == D, "ERROR: CopyofD==D is false");
        cout << "\nOK: CopyofD==D is true\n";

        //-------------------------------------------------------------
        try
        {
            cout << "\nACTION: F = C - D\n";
            F = C - D;
            cout << "RESULT: F = " << F;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        try
        {
            cout << "\nACTION: E = D + F\n";
            E = D + F;
            cout << "RESULT: E = " << E;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        Assert(C == E, "ERROR: C==E is false");
        cout << "\nOK: C==E is true\n";

        //-------------------------------------------------------------
        try
        {
            cout << "\nACTION: F = A * B\n";
            F = A * B;
            cout << "RESULT: F = " << F;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        try
        {
            cout << "\nACTION: E = F / A\n";
            E = F / A;
            cout << "RESULT: E = " << E;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        Assert(B == E, "ERROR: B==E is false");
        cout << "\nOK: B==E is true\n";

        //-------------------------------------------------------------
        try
        {
            cout << "\nACTION: F = A / B\n";
            F = A / B;
            cout << "RESULT: F = " << F;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        try
        {
            cout << "\nACTION: E = F * B\n";
            E = F * B;
            cout << "RESULT: E = " << E;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        Assert(A == E, "ERROR: A==E is false");
        cout << "\nOK: A==E is true\n";

        //-------------------------------------------------------------
        try
        {
            cout << "\nACTION: E = a * B\n";
            E = a * B;
            cout << "RESULT: E = " << E;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        try
        {
            cout << "\nACTION: F = A * b\n";
            F = A * b;
            cout << "RESULT: F = " << F;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        try
        {
            cout << "\nACTION: G = E + F\n";
            G = E + F;
            cout << "RESULT: G = " << G;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        try
        {
            cout << "\nACTION: E = B * a\n";
            E = B * a;
            cout << "RESULT: E = " << E;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        try
        {
            cout << "\nACTION: F = b * A\n";
            F = b * A;
            cout << "RESULT: F = " << F;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        try
        {
            cout << "\nACTION: H = F + E\n";
            H = F + E;
            cout << "RESULT: G = " << G;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        Assert(G == H, "ERROR: G==H is false");
        cout << "\nOK: G==H is true\n";

        //-------------------------------------------------------------
        try
        {
            cout << "\nACTION: G = A * B + C * D\n";
            G = A * B + C * D;
            cout << "RESULT: G = " << G;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        try
        {
            cout << "\nACTION: H = D * C + B * A\n";
            H = D * C + B * A;
            cout << "RESULT: H = " << H;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        Assert(G == H, "ERROR: G==H is false");
        cout << "\nOK: G==H is true\n";

        //-------------------------------------------------------------
        try
        {
            cout << "\nACTION: G = A * B * C * D\n";
            G = A * B * C * D;
            cout << "RESULT: G = " << G;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        try
        {
            cout << "\nACTION: G = G / A\n";
            H = (((G / A) / D) / C);
            cout << "RESULT: G = " << H;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        Assert(B == H, "ERROR: B==H is false");
        cout << "\nOK: B==H is true\n";

        //-------------------------------------------------------------
        try
        {
            cout << "\nACTION: G = A * B * C * D * A * B * D * C\n";
            G = A * B * C * D * A * B * D * C;
            cout << "RESULT: G = " << G;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        try
        {
            cout << "\nACTION: H = A * A * C * C * B * B * D * D\n";
            H = A * A * C * C * B * B * D * D;
            cout << "RESULT: H = " << H;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        Assert(G == H, "ERROR: G==H is false");
        cout << "\nOK: G==H is true\n";

        //-------------------------------------------------------------
        try
        {
            cout << "\nACTION: E = (A + B) * C\n";
            E = (A + B) * C;
            cout << "RESULT: E = " << E;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        try
        {
            cout << "\nACTION: F = A * C + B * C\n";
            F = A * C + B * C;
            cout << "RESULT: F = " << F;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        Assert(E == F, "ERROR: E==F is false");
        cout << "\nOK: E==F is true\n";

        //-------------------------------------------------------------
        try
        {
            cout << "\nACTION: E = (A + C) * (B + D)\n";
            E = (A + C) * (B + D);
            cout << "RESULT: E = " << E;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        try
        {
            cout << "\nACTION: F = B * A + D * A + C * B + D * C\n";
            F = B * A + D * A + C * B + D * C;
            cout << "RESULT: F = " << F;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        Assert(E == F, "ERROR: E==F is false");
        cout << "\nOK: E==F is true\n";

        //-------------------------------------------------------------
        try
        {
            cout << "\nACTION: E = (A + C) / (B + D)\n";
            cout << "A + C = " << (A + C) << endl;
            cout << "B + D = " << (B + D) << endl;
            E = (A + C) / (B + D);
            cout << "RESULT: E = " << E;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        try
        {
            cout << "\nACTION: F = (D + B) / (C + A)\n";
            F = (D + B) / (C + A);
            cout << "RESULT: F = " << F;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        try
        {
            cout << "\nACTION: G = E * F\n";
            G = E * F;
            cout << "RESULT: G = " << G;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        //-------------------------------------------------------------
        try
        {
            cout << "\nACTION: E = 2*A + C*D\n";
            E = 2 * A + C * D;
            cout << "RESULT: E = " << E;
            cout << "\nACTION: F = B*B - 5*D\n";
            F = B * B - 5 * D;
            cout << "RESULT: F = " << F;
            cout << "\nACTION: G = E / F\n";
            G = E / F;
            cout << "RESULT: G = " << G;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        try
        {
            cout << "\nACTION: F = ((-D)*5 + B*B) / (D*C + A*2)\n";
            F = ((-D) * 5 + B * B) / (D * C + A * 2);
            cout << "RESULT: F = " << F;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        try
        {
            cout << "\nACTION: G = E * F\n";
            G = E * F;
            cout << "RESULT: G = " << G;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        //-------------------------------------------------------------
        try
        {
            cout << "\nACTION: E = A / A\n";
            E = A / A;
            cout << "RESULT: E = " << E;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        //-------------------------------------------------------------
        try
        {
            cout << "\nACTION: E = sqrt(A)\n";
            E = A.sqrt();
            cout << "RESULT: E = " << E;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        Assert(E.value() >= 0, "ERROR: A has no root");

        try
        {
            cout << "\nACTION: F = E * E\n";
            F = E * E;
            cout << "RESULT: F = " << F;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        Assert(A == F, "ERROR: A==F is false");
        cout << "\nOK: A==F is true\n";

        cout << "\n---------------------------------------------------\n";
    }
    printf("passed\n");
}